

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,int>
          (TryCast *this,string_t input,int32_t *result,bool strict)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  char cVar12;
  long lVar13;
  byte bVar14;
  undefined4 uVar15;
  char *pcVar16;
  ulong uVar17;
  idx_t iVar18;
  bool bVar19;
  ExponentData exponent;
  byte local_88;
  IntegerDecimalCastData<int> local_78;
  int *local_58;
  undefined4 local_4c;
  ulong local_48;
  string_t input_local;
  
  local_58 = input.value._8_8_;
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar16 = input.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar16 = input_local.value.pointer.prefix;
  }
  uVar5 = (ulong)this & 0xffffffff;
  uVar17 = 0;
  while( true ) {
    uVar8 = uVar5 - uVar17;
    local_88 = (byte)result;
    input_local.value._0_8_ = this;
    if (uVar8 == 0) break;
    bVar1 = pcVar16[uVar17];
    if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
      if (bVar1 == 0x2d) {
        uVar9 = uVar5 - uVar17;
        iVar3 = 0;
        uVar8 = 1;
        goto LAB_01267195;
      }
      if ((uVar5 - 1 == uVar17) || (bVar1 != 0x30)) {
        if ((local_88 & bVar1 == 0x2b) == 0) {
          uVar9 = (ulong)(bVar1 == 0x2b);
LAB_01267390:
          iVar3 = 0;
          uVar11 = uVar9;
          goto LAB_0126739c;
        }
        break;
      }
      cVar12 = pcVar16[uVar17 + 1];
      if (cVar12 == 'B') {
LAB_0126747b:
        uVar8 = ~uVar17 + uVar5;
        uVar11 = 1;
        iVar3 = 0;
        goto LAB_0126748d;
      }
      if (cVar12 != 'x') {
        if (cVar12 == 'b') goto LAB_0126747b;
        if (cVar12 != 'X') {
          if ((local_88 & (byte)(cVar12 - 0x30U) < 10) == 0) {
            uVar9 = 0;
            goto LAB_01267390;
          }
          break;
        }
      }
      local_48 = ~uVar17 + uVar5;
      iVar3 = 0;
      uVar11 = 1;
      goto LAB_0126728f;
    }
    uVar17 = uVar17 + 1;
  }
LAB_01267645:
  for (uVar17 = 0; uVar8 = uVar5 - uVar17, uVar8 != 0; uVar17 = uVar17 + 1) {
    bVar1 = pcVar16[uVar17];
    if ((0x20 < (ulong)bVar1) || ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
      local_78._16_8_ = 0;
      local_78.result = 0;
      local_78.decimal = 0;
      if (bVar1 == 0x2d) {
        local_78.result = 0;
        uVar9 = 1;
        goto LAB_01267699;
      }
      if ((uVar5 - 1 != uVar17) && (bVar1 == 0x30)) {
        cVar12 = pcVar16[uVar17 + 1];
        if (cVar12 == 'B') {
LAB_012679f8:
          local_78.result = 0;
          uVar8 = 1;
          goto LAB_01267a13;
        }
        if (cVar12 != 'x') {
          if (cVar12 == 'b') goto LAB_012679f8;
          if (cVar12 != 'X') {
            if ((local_88 & (byte)(cVar12 - 0x30U) < 10) != 0) {
              return false;
            }
            uVar9 = 0;
            goto LAB_0126786c;
          }
        }
        lVar13 = 0;
        uVar8 = 1;
        goto LAB_01267786;
      }
      if ((local_88 & bVar1 == 0x2b) == 0) {
        uVar9 = (ulong)(bVar1 == 0x2b);
LAB_0126786c:
        local_78.result = 0;
        uVar11 = uVar9;
        goto LAB_01267877;
      }
      break;
    }
  }
  goto LAB_01267e33;
LAB_01267195:
  uVar11 = uVar8;
  if (uVar9 <= uVar11) goto joined_r0x0126762d;
  bVar1 = pcVar16[uVar17 + uVar11];
  bVar14 = bVar1 - 0x30;
  if (9 < bVar14) {
    if (bVar1 == 0x2e) {
      if (local_88 != 0) goto LAB_01267645;
      if (uVar9 <= uVar11 + 1) goto joined_r0x0126762d;
      if ((uVar11 < 2) ||
         (bVar1 = pcVar16[uVar17 + 1 + uVar11], uVar11 = uVar11 + 1, (byte)(bVar1 - 0x30) < 10))
      goto LAB_01267645;
    }
    if ((bVar1 < 0x21) && ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      uVar8 = uVar11 + 1;
      uVar11 = uVar8;
      if (uVar8 < uVar9) {
        uVar11 = uVar9;
      }
      goto LAB_01267541;
    }
    goto LAB_01267645;
  }
  uVar2 = (0x80000000 - bVar14) / 10;
  if ((SBORROW4(iVar3,-uVar2) != (int)(iVar3 + uVar2) < 0) ||
     (((iVar3 = iVar3 * 10 - (uint)bVar14, uVar8 = uVar9, ~uVar11 + uVar5 != uVar17 &&
       (uVar8 = uVar11 + 1, pcVar16[uVar17 + 1 + uVar11] == '_' && local_88 == 0)) &&
      (((uVar5 - uVar11) - 2 == uVar17 ||
       (uVar8 = uVar11 + 2, 9 < (byte)(pcVar16[uVar17 + 2 + uVar11] - 0x30U)))))))
  goto LAB_01267645;
  goto LAB_01267195;
LAB_01267541:
  if (uVar9 <= uVar8) goto joined_r0x0126762d;
  if ((0x20 < (ulong)(byte)pcVar16[uVar17 + uVar8]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar17 + uVar8] & 0x3f) & 1) == 0)) goto LAB_01267645;
  uVar8 = uVar8 + 1;
  goto LAB_01267541;
LAB_0126748d:
  if (uVar8 <= uVar11) goto joined_r0x0126762d;
  iVar10 = 0;
  if (pcVar16[uVar17 + 1 + uVar11] != '0') {
    if (pcVar16[uVar17 + 1 + uVar11] != '1') goto LAB_01267645;
    iVar10 = 1;
  }
  uVar9 = uVar8;
  if ((uVar5 - uVar11) - 2 != uVar17) {
    if (pcVar16[uVar17 + 2 + uVar11] == '_') {
      if (((uVar5 - uVar11) - 3 == uVar17) || ((pcVar16[uVar17 + 3 + uVar11] & 0xfeU) != 0x30))
      goto LAB_01267645;
      uVar9 = uVar11 + 2;
    }
    else {
      uVar9 = uVar11 + 1;
    }
  }
  uVar11 = uVar9;
  if (0x3fffffff < iVar3) goto LAB_01267645;
  iVar3 = iVar10 + iVar3 * 2;
  goto LAB_0126748d;
LAB_0126739c:
  uVar4 = uVar11;
  if (uVar8 <= uVar4) goto LAB_0126757a;
  bVar1 = pcVar16[uVar17 + uVar4];
  bVar14 = bVar1 - 0x30;
  if (9 < bVar14) {
    if (bVar1 == 0x2e) {
      if (local_88 != 0) goto LAB_01267645;
      uVar11 = uVar4 + 1;
      if (uVar8 <= uVar11) {
        bVar19 = uVar9 < uVar4;
        uVar4 = uVar11;
        if (bVar19) goto LAB_0126757a;
        goto LAB_01267645;
      }
      if ((uVar4 <= uVar9) ||
         (bVar1 = pcVar16[uVar17 + 1 + uVar4], uVar4 = uVar11, (byte)(bVar1 - 0x30) < 10))
      goto LAB_01267645;
    }
    if ((bVar1 < 0x21) && ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      uVar11 = uVar4 + 1;
      uVar4 = uVar11;
      if (uVar11 < uVar8) {
        uVar4 = uVar8;
      }
      goto LAB_01267606;
    }
    goto LAB_01267645;
  }
  if (((int)((bVar14 ^ 0x7ffffffe) / 10) < iVar3) ||
     (((iVar3 = iVar3 * 10 + (uint)bVar14, uVar11 = uVar8, ~uVar4 + uVar5 != uVar17 &&
       (uVar11 = uVar4 + 1, pcVar16[uVar17 + 1 + uVar4] == '_' && local_88 == 0)) &&
      (((uVar5 - uVar4) - 2 == uVar17 ||
       (uVar11 = uVar4 + 2, 9 < (byte)(pcVar16[uVar17 + 2 + uVar4] - 0x30U))))))) goto LAB_01267645;
  goto LAB_0126739c;
LAB_01267606:
  if (uVar8 <= uVar11) goto LAB_0126757a;
  if ((0x20 < (ulong)(byte)pcVar16[uVar17 + uVar11]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar17 + uVar11] & 0x3f) & 1) == 0)) goto LAB_01267645;
  uVar11 = uVar11 + 1;
  goto LAB_01267606;
LAB_0126757a:
  if (uVar9 < uVar4) goto LAB_0126762f;
  goto LAB_01267645;
LAB_0126728f:
  if (local_48 <= uVar11) goto joined_r0x0126762d;
  bVar1 = pcVar16[uVar17 + 1 + uVar11];
  bVar14 = bVar1 | 0x20;
  if (0x19 < (byte)(bVar1 + 0xbf)) {
    bVar14 = bVar1;
  }
  bVar19 = StringUtil::CharacterIsHex(bVar14);
  if (!bVar19) goto LAB_01267645;
  uVar15 = 0xd0;
  if ('`' < (char)bVar14) {
    uVar15 = 0xa9;
  }
  uVar8 = local_48;
  if ((uVar5 - uVar11) - 2 != uVar17) {
    if (pcVar16[uVar17 + 2 + uVar11] == '_') {
      local_4c = uVar15;
      if (((uVar5 - uVar11) - 3 == uVar17) ||
         (bVar19 = StringUtil::CharacterIsHex(pcVar16[uVar17 + 3 + uVar11]), !bVar19))
      goto LAB_01267645;
      uVar8 = uVar11 + 2;
      uVar15 = local_4c;
    }
    else {
      uVar8 = uVar11 + 1;
    }
  }
  bVar14 = (char)uVar15 + bVar14;
  if ((int)(bVar14 >> 4 ^ 0x7ffffff) < iVar3) goto LAB_01267645;
  iVar3 = iVar3 * 0x10 + (uint)bVar14;
  uVar11 = uVar8;
  goto LAB_0126728f;
joined_r0x0126762d:
  if (uVar11 < 2) goto LAB_01267645;
LAB_0126762f:
  *local_58 = iVar3;
  goto LAB_01267c3f;
LAB_01267699:
  uVar11 = uVar9;
  if (uVar8 <= uVar11) goto LAB_01267915;
  bVar1 = pcVar16[uVar17 + uVar11];
  bVar14 = bVar1 - 0x30;
  if (9 < bVar14) {
    if (bVar1 != 0x2e) goto LAB_01267a96;
    if (local_88 != 0) goto LAB_01267e33;
    uVar9 = uVar11 + 1;
    local_78.decimal_digits = 0;
    uVar4 = uVar9;
    local_78.decimal = 0;
    goto LAB_0126795f;
  }
  uVar9 = (0x8000000000000000 - (ulong)bVar14) / 10;
  if (SBORROW8(local_78.result,-uVar9) != (long)(local_78.result + uVar9) < 0) {
    return false;
  }
  local_78.result = local_78.result * 10 - (ulong)bVar14;
  uVar9 = uVar8;
  if ((~uVar11 + uVar5 != uVar17) &&
     (uVar9 = uVar11 + 1, pcVar16[uVar17 + 1 + uVar11] == '_' && local_88 == 0)) {
    if ((uVar5 - uVar11) - 2 == uVar17) goto LAB_01267e33;
    uVar9 = uVar11 + 2;
    if (9 < (byte)(pcVar16[uVar17 + 2 + uVar11] - 0x30U)) {
      return false;
    }
  }
  goto LAB_01267699;
LAB_0126795f:
  uVar7 = uVar4;
  if (uVar8 <= uVar7) {
    bVar19 = 1 < uVar11;
    local_78._18_6_ = 0;
    uVar11 = uVar7;
    if (uVar9 < uVar7 || bVar19) goto LAB_01267915;
    goto LAB_01267e33;
  }
  bVar1 = pcVar16[uVar17 + uVar7];
  bVar14 = bVar1 - 0x30;
  if (9 < bVar14) {
    bVar19 = 1 < uVar11;
    local_78._18_6_ = 0;
    uVar11 = uVar7;
    if (uVar9 < uVar7 || bVar19) goto LAB_01267a96;
    goto LAB_01267e33;
  }
  uVar4 = ((ulong)bVar14 ^ 0x7ffffffffffffffe) / 10;
  lVar13 = local_78.decimal * 10 + (ulong)bVar14;
  if ((long)uVar4 < local_78.decimal) {
    lVar13 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar4);
  uVar4 = uVar8;
  local_78.decimal = lVar13;
  if ((~uVar7 + uVar5 != uVar17) && (uVar4 = uVar7 + 1, pcVar16[uVar17 + 1 + uVar7] == '_')) {
    if ((uVar5 - uVar7) - 2 == uVar17) goto LAB_01267e33;
    uVar4 = uVar7 + 2;
    if (9 < (byte)(pcVar16[uVar17 + 2 + uVar7] - 0x30U)) {
      return false;
    }
  }
  goto LAB_0126795f;
LAB_01267a96:
  uVar2 = (uint)bVar1;
  if (4 < uVar2 - 9) {
    if ((uVar2 == 0x65) || (uVar2 == 0x45)) {
      if ((uVar11 != 1 && local_88 == 0) && (uVar11 + 1 < uVar8)) {
        exponent.result = 0;
        pcVar16 = pcVar16 + uVar17 + uVar11 + 1;
        iVar18 = ~uVar17 + (uVar5 - uVar11);
        if (*pcVar16 == '-') {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar16,iVar18,&exponent,false);
        }
        else {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar16,iVar18,&exponent,false);
        }
        if (bVar19 != false) {
          bVar19 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<int>,true>
                             (&local_78,exponent.result);
          goto joined_r0x01267c2e;
        }
      }
    }
    else if (uVar2 == 0x20) goto LAB_01267aa5;
    goto LAB_01267e33;
  }
LAB_01267aa5:
  uVar5 = uVar11 + 1;
  uVar11 = uVar5;
  if (uVar5 < uVar8) {
    uVar11 = uVar8;
  }
  for (; uVar5 < uVar8; uVar5 = uVar5 + 1) {
    if ((0x20 < (ulong)(byte)pcVar16[uVar17 + uVar5]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar17 + uVar5] & 0x3f) & 1) == 0))
    goto LAB_01267e33;
  }
LAB_01267915:
  bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,true>
                     (&local_78);
  if (!bVar19) {
    return false;
  }
  if (uVar11 < 2) {
    return false;
  }
  goto LAB_01267c34;
LAB_01267a13:
  if (~uVar17 + uVar5 <= uVar8) goto LAB_01267bcb;
  uVar9 = 0;
  if ((pcVar16[uVar17 + 1 + uVar8] != '0') && (uVar9 = 1, pcVar16[uVar17 + 1 + uVar8] != '1')) {
    return false;
  }
  uVar11 = ~uVar17 + uVar5;
  if ((uVar5 - uVar8) - 2 != uVar17) {
    if (pcVar16[uVar17 + 2 + uVar8] == '_') {
      if (((uVar5 - uVar8) - 3 == uVar17) || ((pcVar16[uVar17 + 3 + uVar8] & 0xfeU) != 0x30))
      goto LAB_01267e33;
      uVar11 = uVar8 + 2;
    }
    else {
      uVar11 = uVar8 + 1;
    }
  }
  uVar8 = uVar11;
  if (0x3fffffffffffffff < local_78.result) goto LAB_01267e33;
  local_78.result = uVar9 + local_78.result * 2;
  goto LAB_01267a13;
LAB_01267bcb:
  bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                     (&local_78);
  goto LAB_01267c29;
LAB_01267786:
  if (~uVar17 + uVar5 <= uVar8) goto LAB_01267c18;
  bVar1 = pcVar16[uVar17 + 1 + uVar8];
  bVar14 = bVar1 | 0x20;
  if (0x19 < (byte)(bVar1 + 0xbf)) {
    bVar14 = bVar1;
  }
  bVar19 = StringUtil::CharacterIsHex(bVar14);
  if (!bVar19) goto LAB_01267e33;
  cVar12 = -0x30;
  if ('`' < (char)bVar14) {
    cVar12 = -0x57;
  }
  uVar9 = ~uVar17 + uVar5;
  if ((uVar5 - uVar8) - 2 != uVar17) {
    if (pcVar16[uVar17 + 2 + uVar8] == '_') {
      if (((uVar5 - uVar8) - 3 == uVar17) ||
         (bVar19 = StringUtil::CharacterIsHex(pcVar16[uVar17 + 3 + uVar8]), !bVar19))
      goto LAB_01267e33;
      uVar9 = uVar8 + 2;
    }
    else {
      uVar9 = uVar8 + 1;
    }
  }
  if ((long)((ulong)((byte)(cVar12 + bVar14) >> 4) ^ 0x7ffffffffffffff) < lVar13) goto LAB_01267e33;
  lVar13 = lVar13 * 0x10 + (ulong)(byte)(cVar12 + bVar14);
  uVar8 = uVar9;
  goto LAB_01267786;
LAB_01267877:
  uVar4 = uVar11;
  if (uVar8 <= uVar4) goto LAB_01267ae8;
  bVar1 = pcVar16[uVar17 + uVar4];
  bVar14 = bVar1 - 0x30;
  if (9 < bVar14) {
    if (bVar1 != 0x2e) goto LAB_01267c49;
    if (local_88 != 0) goto LAB_01267e33;
    uVar11 = uVar4 + 1;
    local_78.decimal_digits = 0;
    uVar7 = uVar11;
    local_78.decimal = 0;
    goto LAB_01267b32;
  }
  if ((long)(((ulong)bVar14 ^ 0x7ffffffffffffffe) / 10) < local_78.result) {
    return false;
  }
  local_78.result = local_78.result * 10 + (ulong)bVar14;
  uVar11 = uVar8;
  if ((~uVar4 + uVar5 != uVar17) &&
     (uVar11 = uVar4 + 1, pcVar16[uVar17 + 1 + uVar4] == '_' && local_88 == 0)) {
    if ((uVar5 - uVar4) - 2 == uVar17) goto LAB_01267e33;
    uVar11 = uVar4 + 2;
    if (9 < (byte)(pcVar16[uVar17 + 2 + uVar4] - 0x30U)) {
      return false;
    }
  }
  goto LAB_01267877;
LAB_01267b32:
  uVar6 = uVar7;
  if (uVar8 <= uVar6) {
    bVar19 = uVar9 < uVar4;
    local_78._18_6_ = 0;
    uVar4 = uVar6;
    if (uVar11 < uVar6 || bVar19) goto LAB_01267ae8;
    goto LAB_01267e33;
  }
  bVar1 = pcVar16[uVar17 + uVar6];
  bVar14 = bVar1 - 0x30;
  if (9 < bVar14) {
    bVar19 = uVar9 < uVar4;
    local_78._18_6_ = 0;
    uVar4 = uVar6;
    if (uVar11 < uVar6 || bVar19) goto LAB_01267c49;
    goto LAB_01267e33;
  }
  uVar7 = ((ulong)bVar14 ^ 0x7ffffffffffffffe) / 10;
  lVar13 = local_78.decimal * 10 + (ulong)bVar14;
  if ((long)uVar7 < local_78.decimal) {
    lVar13 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar7);
  uVar7 = uVar8;
  local_78.decimal = lVar13;
  if ((~uVar6 + uVar5 != uVar17) && (uVar7 = uVar6 + 1, pcVar16[uVar17 + 1 + uVar6] == '_')) {
    if ((uVar5 - uVar6) - 2 == uVar17) goto LAB_01267e33;
    uVar7 = uVar6 + 2;
    if (9 < (byte)(pcVar16[uVar17 + 2 + uVar6] - 0x30U)) {
      return false;
    }
  }
  goto LAB_01267b32;
LAB_01267c49:
  uVar2 = (uint)bVar1;
  if (uVar2 - 9 < 5) {
LAB_01267c58:
    uVar5 = uVar4 + 1;
    uVar4 = uVar5;
    if (uVar5 < uVar8) {
      uVar4 = uVar8;
    }
    for (; uVar5 < uVar8; uVar5 = uVar5 + 1) {
      if ((0x20 < (ulong)(byte)pcVar16[uVar17 + uVar5]) ||
         ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar17 + uVar5] & 0x3f) & 1) == 0))
      goto LAB_01267e33;
    }
LAB_01267ae8:
    bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                       (&local_78);
    if (!bVar19) {
      return false;
    }
    if (uVar4 <= uVar9) {
      return false;
    }
    goto LAB_01267c34;
  }
  if ((uVar2 == 0x65) || (uVar2 == 0x45)) {
    if ((uVar4 == uVar9 || local_88 != 0) || (uVar8 <= uVar4 + 1)) goto LAB_01267e33;
    exponent.result = 0;
    pcVar16 = pcVar16 + uVar17 + uVar4 + 1;
    iVar18 = ~uVar17 + (uVar5 - uVar4);
    if (*pcVar16 == '-') {
      bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar16,iVar18,&exponent,false);
    }
    else {
      bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar16,iVar18,&exponent,false);
    }
    if (bVar19 == false) goto LAB_01267e33;
    bVar19 = IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<int>,false>
                       (&local_78,exponent.result);
    goto joined_r0x01267c2e;
  }
  if (uVar2 == 0x20) goto LAB_01267c58;
  goto LAB_01267e33;
LAB_01267c18:
  local_78.result = lVar13;
  bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                     (&local_78);
LAB_01267c29:
  bVar19 = (bool)(1 < uVar8 & bVar19);
joined_r0x01267c2e:
  if (bVar19 == false) {
LAB_01267e33:
    bVar19 = false;
  }
  else {
LAB_01267c34:
    *local_58 = (int)local_78.result;
LAB_01267c3f:
    bVar19 = true;
  }
  return bVar19;
}

Assistant:

bool TryCast::Operation(string_t input, int32_t &result, bool strict) {
	return TrySimpleIntegerCast<int32_t>(input.GetData(), input.GetSize(), result, strict);
}